

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

void __thiscall
Js::DynamicProfileInfo::RecordAsmJsCallSiteInfo
          (DynamicProfileInfo *this,FunctionBody *callerBody,ProfileId callSiteId,
          FunctionBody *calleeBody)

{
  Type TVar1;
  LocalFunctionId LVar2;
  code *pcVar3;
  bool bVar4;
  ArgSlot AVar5;
  undefined4 *puVar6;
  FunctionBody **ppFVar7;
  AsmJsFunctionInfo *this_00;
  CallSiteInfo **ppCVar8;
  ScriptContext *pSVar9;
  ScriptContext *pSVar10;
  DWORD_PTR DVar11;
  DWORD_PTR DVar12;
  LocalFunctionId local_54;
  Type local_50;
  LocalFunctionId functionId;
  SourceId sourceId;
  LocalFunctionId oldFunctionId;
  SourceId oldSourceId;
  bool doInline;
  AutoCriticalSection local_30;
  AutoCriticalSection cs;
  FunctionBody *calleeBody_local;
  ProfileId callSiteId_local;
  FunctionBody *callerBody_local;
  DynamicProfileInfo *this_local;
  
  cs.cs = (CriticalSection *)calleeBody;
  AutoCriticalSection::AutoCriticalSection(&local_30,(CriticalSection *)callSiteInfoCS);
  if ((((callerBody == (FunctionBody *)0x0) ||
       (bVar4 = ParseableFunctionInfo::GetIsAsmjsMode(&callerBody->super_ParseableFunctionInfo),
       !bVar4)) || (cs.cs == (CriticalSection *)0x0)) ||
     (bVar4 = ParseableFunctionInfo::GetIsAsmjsMode((ParseableFunctionInfo *)cs.cs), !bVar4)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x22c,"((0))",
                                "Call to RecordAsmJsCallSiteInfo without two asm.js/wasm FunctionBody"
                               );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  else {
    bVar4 = NeedProfileInfoList();
    if (((bVar4) && ((this->persistsAcrossScriptContexts & 1U) == 0)) &&
       (ppFVar7 = Memory::WriteBarrierPtr::operator_cast_to_FunctionBody__
                            ((WriteBarrierPtr *)&this->functionBody), *ppFVar7 != callerBody)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                  ,0x233,
                                  "(!DynamicProfileInfo::NeedProfileInfoList() || this->persistsAcrossScriptContexts || this->functionBody == callerBody)"
                                  ,
                                  "!DynamicProfileInfo::NeedProfileInfoList() || this->persistsAcrossScriptContexts || this->functionBody == callerBody"
                                 );
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    this_00 = FunctionBody::GetAsmJsFunctionInfo((FunctionBody *)cs.cs);
    AVar5 = AsmJsFunctionInfo::GetArgCount(this_00);
    oldFunctionId._3_1_ = AVar5 < 0x10;
    if (((FunctionBody *)cs.cs == callerBody) && (callSiteId < 0x20)) {
      this->m_recursiveInlineInfo = this->m_recursiveInlineInfo | 1 << ((byte)callSiteId & 0x1f);
    }
    ppCVar8 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                        ((WriteBarrierPtr *)&this->callSiteInfo);
    if (*(short *)&(*ppCVar8)[callSiteId].field_0x2 < 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                  ,0x244,"(!callSiteInfo[callSiteId].isPolymorphic)",
                                  "!callSiteInfo[callSiteId].isPolymorphic");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    ppCVar8 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                        ((WriteBarrierPtr *)&this->callSiteInfo);
    TVar1 = (*ppCVar8)[callSiteId].u.functionData.sourceId;
    if (TVar1 != 0xfffffffc) {
      ppCVar8 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                          ((WriteBarrierPtr *)&this->callSiteInfo);
      LVar2 = (*ppCVar8)[callSiteId].u.functionData.functionId;
      local_50 = 0xfffffffc;
      pSVar9 = FunctionProxy::GetScriptContext((FunctionProxy *)callerBody);
      pSVar10 = FunctionProxy::GetScriptContext((FunctionProxy *)cs.cs);
      if (pSVar9 == pSVar10) {
        DVar11 = FunctionProxy::GetSecondaryHostSourceContext((FunctionProxy *)callerBody);
        DVar12 = FunctionProxy::GetSecondaryHostSourceContext((FunctionProxy *)cs.cs);
        if (DVar11 == DVar12) {
          DVar11 = FunctionProxy::GetHostSourceContext((FunctionProxy *)callerBody);
          DVar12 = FunctionProxy::GetHostSourceContext((FunctionProxy *)cs.cs);
          if (DVar11 == DVar12) {
            local_50 = 0xfffffffd;
          }
          else {
            DVar11 = FunctionProxy::GetHostSourceContext((FunctionProxy *)cs.cs);
            local_50 = (Type)DVar11;
          }
          local_54 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)cs.cs);
        }
        else {
          local_54 = 0xfffffffe;
        }
      }
      else {
        local_54 = 0xfffffffe;
      }
      if (TVar1 == 0xffffffff) {
        ppCVar8 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                            ((WriteBarrierPtr *)&this->callSiteInfo);
        (*ppCVar8)[callSiteId].u.functionData.sourceId = local_50;
        ppCVar8 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                            ((WriteBarrierPtr *)&this->callSiteInfo);
        (*ppCVar8)[callSiteId].u.functionData.functionId = local_54;
        this->currentInlinerVersion = this->currentInlinerVersion + '\x01';
      }
      else if ((TVar1 != local_50) || (LVar2 != local_54)) {
        if (LVar2 != 0xffffffff) {
          this->currentInlinerVersion = this->currentInlinerVersion + '\x01';
        }
        ppCVar8 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                            ((WriteBarrierPtr *)&this->callSiteInfo);
        (*ppCVar8)[callSiteId].u.functionData.functionId = 0xffffffff;
        oldFunctionId._3_1_ = false;
      }
      ppCVar8 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                          ((WriteBarrierPtr *)&this->callSiteInfo);
      *(ushort *)&(*ppCVar8)[callSiteId].field_0x2 =
           *(ushort *)&(*ppCVar8)[callSiteId].field_0x2 & 0xdfff;
      ppCVar8 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                          ((WriteBarrierPtr *)&this->callSiteInfo);
      *(ushort *)&(*ppCVar8)[callSiteId].field_0x2 =
           *(ushort *)&(*ppCVar8)[callSiteId].field_0x2 & 0xbfff |
           ((byte)~oldFunctionId._3_1_ & 1) << 0xe;
      ppCVar8 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                          ((WriteBarrierPtr *)&this->callSiteInfo);
      (*ppCVar8)[callSiteId].ldFldInlineCacheId = 0xffffffff;
    }
  }
  AutoCriticalSection::~AutoCriticalSection(&local_30);
  return;
}

Assistant:

void DynamicProfileInfo::RecordAsmJsCallSiteInfo(FunctionBody* callerBody, ProfileId callSiteId, FunctionBody* calleeBody)
    {
        AutoCriticalSection cs(&this->callSiteInfoCS);

        if (!callerBody || !callerBody->GetIsAsmjsMode() || !calleeBody || !calleeBody->GetIsAsmjsMode())
        {
            AssertMsg(UNREACHED, "Call to RecordAsmJsCallSiteInfo without two asm.js/wasm FunctionBody");
            return;
        }

#if DBG_DUMP || defined(DYNAMIC_PROFILE_STORAGE) || defined(RUNTIME_DATA_COLLECTION)
        // If we persistsAcrossScriptContext, the dynamic profile info may be referred to by multiple function body from
        // different script context
        Assert(!DynamicProfileInfo::NeedProfileInfoList() || this->persistsAcrossScriptContexts || this->functionBody == callerBody);
#endif

        bool doInline = true;
        // This is a hard limit as we only use 4 bits to encode the actual count in the InlineeCallInfo
        if (calleeBody->GetAsmJsFunctionInfo()->GetArgCount() > Js::InlineeCallInfo::MaxInlineeArgoutCount)
        {
            doInline = false;
        }

        // Mark the callsite bit where caller and callee is same function
        if (calleeBody == callerBody && callSiteId < 32)
        {
            this->m_recursiveInlineInfo = this->m_recursiveInlineInfo | (1 << callSiteId);
        }

        // TODO: support polymorphic inlining in wasm
        Assert(!callSiteInfo[callSiteId].isPolymorphic);
        Js::SourceId oldSourceId = callSiteInfo[callSiteId].u.functionData.sourceId;
        if (oldSourceId == InvalidSourceId)
        {
            return;
        }

        Js::LocalFunctionId oldFunctionId = callSiteInfo[callSiteId].u.functionData.functionId;

        Js::SourceId sourceId = InvalidSourceId;
        Js::LocalFunctionId functionId;
        // We can only inline function that are from the same script context
        if (callerBody->GetScriptContext() == calleeBody->GetScriptContext())
        {
            if (callerBody->GetSecondaryHostSourceContext() == calleeBody->GetSecondaryHostSourceContext())
            {
                if (callerBody->GetHostSourceContext() == calleeBody->GetHostSourceContext())
                {
                    sourceId = CurrentSourceId; // Caller and callee in same file
                }
                else
                {
                    sourceId = (Js::SourceId)calleeBody->GetHostSourceContext(); // Caller and callee in different files
                }
                functionId = calleeBody->GetLocalFunctionId();
            }
            else
            {
                // Pretend that we are cross context when call is crossing script file.
                functionId = CallSiteCrossContext;
            }
        }
        else
        {
            functionId = CallSiteCrossContext;
        }

        if (oldSourceId == NoSourceId)
        {
            callSiteInfo[callSiteId].u.functionData.sourceId = sourceId;
            callSiteInfo[callSiteId].u.functionData.functionId = functionId;
            this->currentInlinerVersion++; // we don't mind if this overflows
        }
        else if (oldSourceId != sourceId || oldFunctionId != functionId)
        {
            if (oldFunctionId != CallSiteMixed)
            {
                this->currentInlinerVersion++; // we don't mind if this overflows
            }

            callSiteInfo[callSiteId].u.functionData.functionId = CallSiteMixed;
            doInline = false;
        }
        callSiteInfo[callSiteId].isConstructorCall = false;
        callSiteInfo[callSiteId].dontInline = !doInline;
        callSiteInfo[callSiteId].ldFldInlineCacheId = Js::Constants::NoInlineCacheIndex;
    }